

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QVariant>::emplace<QVariant>
          (QMovableArrayOps<QVariant> *this,qsizetype i,QVariant *args)

{
  QVariant **ppQVar1;
  qsizetype *pqVar2;
  undefined8 *puVar3;
  Data *pDVar4;
  QVariant *pQVar5;
  QVariant *pQVar6;
  PrivateShared *pPVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  QVariant *__dest;
  long in_FS_OFFSET;
  bool bVar10;
  Inserter local_80;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 uStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0015d7f4:
    local_58.shared = (args->d).data.shared;
    local_58._8_8_ = *(undefined8 *)((long)&(args->d).data + 8);
    local_58._16_8_ = *(undefined8 *)((long)&(args->d).data + 0x10);
    uStack_40 = *(undefined8 *)&(args->d).field_0x18;
    (args->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(args->d).data + 8) = 0;
    *(undefined8 *)((long)&(args->d).data + 0x10) = 0;
    *(undefined8 *)&(args->d).field_0x18 = 2;
    bVar10 = (this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.size != 0;
    QArrayDataPointer<QVariant>::detachAndGrow
              ((QArrayDataPointer<QVariant> *)this,(uint)(i == 0 && bVar10),1,(QVariant **)0x0,
               (QArrayDataPointer<QVariant> *)0x0);
    if (i == 0 && bVar10) {
      pQVar5 = (this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.ptr;
      *(undefined8 *)((long)&pQVar5[-1].d.data + 0x10) = local_58._16_8_;
      *(undefined8 *)&pQVar5[-1].d.field_0x18 = uStack_40;
      pQVar5[-1].d.data.shared = local_58.shared;
      *(undefined8 *)((long)&pQVar5[-1].d.data + 8) = local_58._8_8_;
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = 0;
      local_58._16_8_ = 0;
      uStack_40 = 2;
      ppQVar1 = &(this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      pQVar6 = (this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.ptr;
      pQVar5 = pQVar6 + i;
      __dest = pQVar5 + 1;
      local_80.nInserts = 1;
      local_80.bytes =
           ((this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.size - i) *
           0x20;
      local_80.data = (QArrayDataPointer<QVariant> *)this;
      local_80.displaceTo = __dest;
      memmove(__dest,pQVar6 + i,local_80.bytes);
      *(undefined8 *)((long)&(pQVar5->d).data + 0x10) = local_58._16_8_;
      *(undefined8 *)&(pQVar5->d).field_0x18 = uStack_40;
      (pQVar5->d).data.shared = local_58.shared;
      *(undefined8 *)((long)&(pQVar5->d).data + 8) = local_58._8_8_;
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = 0;
      local_58._16_8_ = 0;
      uStack_40 = 2;
      local_80.displaceFrom = __dest;
      Inserter::~Inserter(&local_80);
    }
    QVariant::~QVariant((QVariant *)&local_58);
  }
  else {
    if (((this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.size == i) &&
       (pQVar5 = (this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.ptr,
       (pDVar4->super_QArrayData).alloc !=
       ((long)((long)pQVar5 -
              ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 5) +
       i)) {
      pPVar7 = (args->d).data.shared;
      uVar8 = *(undefined8 *)((long)&(args->d).data + 8);
      uVar9 = *(undefined8 *)&(args->d).field_0x18;
      puVar3 = (undefined8 *)((long)&pQVar5[i].d.data + 0x10);
      *puVar3 = *(undefined8 *)((long)&(args->d).data + 0x10);
      puVar3[1] = uVar9;
      pQVar5[i].d.data.shared = pPVar7;
      *(undefined8 *)((long)&pQVar5[i].d.data + 8) = uVar8;
      (args->d).data.shared = (PrivateShared *)0x0;
      *(undefined8 *)((long)&(args->d).data + 8) = 0;
      *(undefined8 *)((long)&(args->d).data + 0x10) = 0;
      *(undefined8 *)&(args->d).field_0x18 = 2;
    }
    else {
      if ((i != 0) ||
         (pQVar5 = (this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.ptr,
         (QVariant *)((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
         pQVar5)) goto LAB_0015d7f4;
      pPVar7 = (args->d).data.shared;
      uVar8 = *(undefined8 *)((long)&(args->d).data + 8);
      uVar9 = *(undefined8 *)&(args->d).field_0x18;
      *(undefined8 *)((long)&pQVar5[-1].d.data + 0x10) =
           *(undefined8 *)((long)&(args->d).data + 0x10);
      *(undefined8 *)&pQVar5[-1].d.field_0x18 = uVar9;
      pQVar5[-1].d.data.shared = pPVar7;
      *(undefined8 *)((long)&pQVar5[-1].d.data + 8) = uVar8;
      (args->d).data.shared = (PrivateShared *)0x0;
      *(undefined8 *)((long)&(args->d).data + 8) = 0;
      *(undefined8 *)((long)&(args->d).data + 0x10) = 0;
      *(undefined8 *)&(args->d).field_0x18 = 2;
      ppQVar1 = &(this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }